

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perrno.c
# Opt level: O0

void err_mess(char *from,int no)

{
  int iVar1;
  int *piVar2;
  int save_errno;
  int no_local;
  char *from_local;
  
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  flush_pty();
  fprintf(_stderr,"System call error: %s errno=%d ",from,(ulong)(uint)no);
  perror("");
  piVar2 = __errno_location();
  *piVar2 = iVar1;
  return;
}

Assistant:

void err_mess(char *from, int no) {
  int save_errno = errno; /* Save errno around OSMESSAGE_PRINT */

  OSMESSAGE_PRINT({
    (void)fprintf(stderr, "System call error: %s errno=%d ", from, no);
    perror("");
  });

  errno = save_errno;
}